

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestingUtility.h
# Opt level: O0

bool __thiscall
BaseParticleFixture<pica::Particle<(pica::Dimension)2>>::
eqParticles_<pica::Particle<(pica::Dimension)2>,pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>>::ConstParticleRef>
          (BaseParticleFixture<pica::Particle<(pica::Dimension)2>_> *this,
          Particle<(pica::Dimension)2> a,ConstParticleRef b)

{
  bool bVar1;
  MassType MVar2;
  MassType MVar3;
  ChargeType CVar4;
  ChargeType CVar5;
  FactorType FVar6;
  FactorType FVar7;
  ConstParticleRef *in_stack_ffffffffffffff70;
  ConstParticleRef *in_stack_ffffffffffffff80;
  bool local_69;
  Particle<(pica::Dimension)2> *in_stack_ffffffffffffffa0;
  ConstParticleRef *in_stack_ffffffffffffffc0;
  PositionType local_38;
  PositionType local_28 [2];
  
  local_28[0] = pica::Particle<(pica::Dimension)2>::getPosition
                          ((Particle<(pica::Dimension)2> *)&stack0x00000008);
  local_38 = pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::ConstParticleRef::
             getPosition(in_stack_ffffffffffffff80);
  bVar1 = pica::operator==(local_28,&local_38);
  local_69 = false;
  if (bVar1) {
    pica::Particle<(pica::Dimension)2>::getMomentum(in_stack_ffffffffffffffa0);
    pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::ConstParticleRef::getMomentum
              (in_stack_ffffffffffffffc0);
    bVar1 = pica::operator==((Vector3<double> *)&stack0xffffffffffffffb0,
                             (Vector3<double> *)&stack0xffffffffffffff98);
    local_69 = false;
    if (bVar1) {
      MVar2 = pica::Particle<(pica::Dimension)2>::getMass
                        ((Particle<(pica::Dimension)2> *)&stack0x00000008);
      MVar3 = pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::ConstParticleRef::getMass
                        (in_stack_ffffffffffffff70);
      local_69 = false;
      if ((MVar2 == MVar3) && (!NAN(MVar2) && !NAN(MVar3))) {
        CVar4 = pica::Particle<(pica::Dimension)2>::getCharge
                          ((Particle<(pica::Dimension)2> *)&stack0x00000008);
        CVar5 = pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::ConstParticleRef::
                getCharge(in_stack_ffffffffffffff70);
        local_69 = false;
        if ((CVar4 == CVar5) && (!NAN(CVar4) && !NAN(CVar5))) {
          FVar6 = pica::Particle<(pica::Dimension)2>::getFactor
                            ((Particle<(pica::Dimension)2> *)&stack0x00000008);
          FVar7 = pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::ConstParticleRef::
                  getFactor((ConstParticleRef *)0x21ccc0);
          local_69 = FVar6 == FVar7;
        }
      }
    }
  }
  return local_69;
}

Assistant:

bool eqParticles_(ConstParticleRef1 a, ConstParticleRef2 b) const
    {
        return (a.getPosition() == b.getPosition()) &&
            (a.getMomentum() == b.getMomentum()) &&
            (a.getMass() == b.getMass()) &&
            (a.getCharge() == b.getCharge()) &&
            (a.getFactor() == b.getFactor());
    }